

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

bool __thiscall
TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::TPZReference::Increment(TPZReference *this)

{
  TPZReference *this_local;
  
  LOCK();
  (this->fCounter).super___atomic_base<int>._M_i =
       (this->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  return true;
}

Assistant:

bool Increment()
        {
//            std::mutex *mut = get_ap_mutex((void*) this);
//            std::unique_lock<std::mutex> lck(*mut);//already locks
            fCounter.fetch_add(1);
//            lck.unlock();
            return true;
        }